

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::add_rule
          (filter_impl<std::array<unsigned_char,_4UL>_> *this,array<unsigned_char,_4UL> first,
          array<unsigned_char,_4UL> last,uint32_t flags)

{
  _Rb_tree_header *p_Var1;
  uchar *puVar2;
  uchar uVar3;
  uint32_t a;
  _Base_ptr p_Var4;
  iterator __position;
  iterator __last;
  long lVar5;
  const_iterator __first;
  uint32_t uVar6;
  _Alloc_node __an;
  array<unsigned_char,_4UL> tmp;
  range local_50;
  _Type local_44;
  _Type local_40;
  array<unsigned_char,_4UL> local_3c;
  range local_38;
  
  local_44 = first._M_elems;
  range::range(&local_50,first,0);
  __position = ::std::
               _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
               ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                              *)this,&local_50);
  local_3c._M_elems = last._M_elems;
  range::range(&local_50,last,0);
  __last = ::std::
           _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
           ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                          *)this,&local_50);
  p_Var4 = (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__position._M_node != p_Var4) {
    __position._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__position._M_node);
  }
  uVar6 = *(uint32_t *)&__position._M_node[1].field_0x4;
  lVar5 = ::std::_Rb_tree_decrement(__last._M_node);
  a = *(uint32_t *)(lVar5 + 0x24);
  if (uVar6 == flags || (_Type)__position._M_node[1]._M_color == local_44) {
    if (__position._M_node != p_Var4) {
      lVar5 = ::std::_Rb_tree_decrement(__position._M_node);
      if (*(uint32_t *)(lVar5 + 0x24) == flags) {
        __position._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__position._M_node);
        uVar6 = *(uint32_t *)&__position._M_node[1].field_0x4;
      }
    }
  }
  else {
    range::range(&local_38,first,flags);
    local_50 = (range)this;
    __position = ::std::
                 _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                 ::
                 _M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>::_Alloc_node>
                           ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                             *)this,__position._M_node,&local_38,(_Alloc_node *)&local_50);
  }
  if (__position._M_node != __last._M_node) {
    __first._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
    ::_M_erase_aux((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                    *)this,__first,(const_iterator)__last._M_node);
  }
  if ((_Type)__position._M_node[1]._M_color == local_44) {
    __position._M_node[1]._M_color = (_Rb_tree_color)first._M_elems;
    *(uint32_t *)&__position._M_node[1].field_0x4 = flags;
  }
  else if (uVar6 != flags) {
    range::range(&local_38,first,flags);
    local_50 = (range)this;
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
    ::
    _M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>::_Alloc_node>
              ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                *)this,(const_iterator)__position._M_node,&local_38,(_Alloc_node *)&local_50);
  }
  p_Var1 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__last._M_node == p_Var1) {
LAB_0021a8d1:
    if (((_Rb_tree_header *)__last._M_node != p_Var1) || (local_3c._M_elems == (_Type)0xffffffff))
    goto LAB_0021a928;
  }
  else {
    local_40 = (_Type)__last._M_node[1]._M_color;
    lVar5 = 3;
    do {
      if (lVar5 == -1) break;
      puVar2 = local_40 + lVar5;
      uVar3 = *puVar2;
      *puVar2 = *puVar2 + 0xff;
      lVar5 = lVar5 + -1;
    } while (uVar3 == '\0');
    if (local_40 == local_3c._M_elems) goto LAB_0021a8d1;
  }
  if (a != flags) {
    local_50.start._M_elems[0] = local_3c._M_elems[0];
    local_50.start._M_elems[1] = local_3c._M_elems[1];
    local_50.start._M_elems[2] = local_3c._M_elems[2];
    local_50.start._M_elems[3] = local_3c._M_elems[3];
    lVar5 = 3;
    do {
      if (lVar5 == -1) break;
      puVar2 = local_50.start._M_elems + lVar5;
      *puVar2 = *puVar2 + '\x01';
      lVar5 = lVar5 + -1;
    } while (*puVar2 == '\0');
    range::range(&local_38,local_50.start,a);
    local_50 = (range)this;
    __last = ::std::
             _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
             ::
             _M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>::_Alloc_node>
                       ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                         *)this,__last._M_node,&local_38,(_Alloc_node *)&local_50);
  }
LAB_0021a928:
  if (((_Rb_tree_header *)__last._M_node != p_Var1) &&
     (*(uint32_t *)&__last._M_node[1].field_0x4 == flags)) {
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
    ::erase_abi_cxx11_((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                        *)this,(const_iterator)__last._M_node);
  }
  return;
}

Assistant:

void filter_impl<Addr>::add_rule(Addr first, Addr last, std::uint32_t const flags)
	{
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(first < last || first == last);

		auto i = m_access_list.upper_bound(first);
		auto j = m_access_list.upper_bound(last);

		if (i != m_access_list.begin()) --i;

		TORRENT_ASSERT(j != m_access_list.begin());
		TORRENT_ASSERT(j != i);

		std::uint32_t first_access = i->access;
		std::uint32_t last_access = std::prev(j)->access;

		if (i->start != first && first_access != flags)
		{
			i = m_access_list.insert(i, range(first, flags));
		}
		else if (i != m_access_list.begin() && std::prev(i)->access == flags)
		{
			--i;
			first_access = i->access;
		}
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(i != m_access_list.end());

		if (i != j) m_access_list.erase(std::next(i), j);
		if (i->start == first)
		{
			// This is an optimization over erasing and inserting a new element
			// here.
			// this const-cast is OK because we know that the new
			// start address will keep the set correctly ordered
			const_cast<Addr&>(i->start) = first;
			const_cast<std::uint32_t&>(i->access) = flags;
		}
		else if (first_access != flags)
		{
			m_access_list.insert(i, range(first, flags));
		}

		if ((j != m_access_list.end()
				&& minus_one(j->start) != last)
			|| (j == m_access_list.end()
				&& last != max_addr<Addr>()))
		{
			TORRENT_ASSERT(j == m_access_list.end() || last < minus_one(j->start));
			if (last_access != flags)
				j = m_access_list.insert(j, range(plus_one(last), last_access));
		}

		if (j != m_access_list.end() && j->access == flags) m_access_list.erase(j);
		TORRENT_ASSERT(!m_access_list.empty());
	}